

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

void Fl_X::set_default_icons(Fl_RGB_Image **icons,int count)

{
  int count_local;
  Fl_RGB_Image **icons_local;
  
  if (default_net_wm_icons != (unsigned_long *)0x0) {
    if (default_net_wm_icons != (unsigned_long *)0x0) {
      operator_delete__(default_net_wm_icons);
    }
    default_net_wm_icons = (unsigned_long *)0x0;
    default_net_wm_icons_size = 0;
  }
  if (0 < count) {
    icons_to_property(icons,count,&default_net_wm_icons,&default_net_wm_icons_size);
  }
  return;
}

Assistant:

void Fl_X::set_default_icons(const Fl_RGB_Image *icons[], int count) {
  if (default_net_wm_icons) {
    delete [] default_net_wm_icons;
    default_net_wm_icons = 0L;
    default_net_wm_icons_size = 0;
  }

  if (count > 0)
    icons_to_property(icons, count,
                      &default_net_wm_icons, &default_net_wm_icons_size);
}